

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O2

int If_LibLutDelaysAreDifferent(If_LibLut_t *pLutLib)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  float (*pafVar5) [33];
  long lVar6;
  
  fVar1 = pLutLib->pLutDelays[1][0];
  if (pLutLib->fVarPinDelays == 0) {
    pafVar5 = pLutLib->pLutDelays + 2;
    lVar4 = 1;
    iVar3 = 1;
    do {
      lVar4 = lVar4 + 1;
      if (pLutLib->LutMax < lVar4) {
        return 0;
      }
      pfVar2 = *pafVar5;
      pafVar5 = pafVar5 + 1;
    } while ((*pfVar2 == fVar1) && (!NAN(*pfVar2) && !NAN(fVar1)));
  }
  else {
    pafVar5 = pLutLib->pLutDelays + 2;
    iVar3 = 0;
    for (lVar4 = 2; lVar4 <= pLutLib->LutMax; lVar4 = lVar4 + 1) {
      lVar6 = 0;
      while (lVar4 != lVar6) {
        pfVar2 = *pafVar5 + lVar6;
        lVar6 = lVar6 + 1;
        if ((*pfVar2 != fVar1) || (NAN(*pfVar2) || NAN(fVar1))) {
          return 1;
        }
      }
      pafVar5 = pafVar5 + 1;
    }
  }
  return iVar3;
}

Assistant:

int If_LibLutDelaysAreDifferent( If_LibLut_t * pLutLib )
{
    int i, k;
    float Delay = pLutLib->pLutDelays[1][0];
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
        for ( k = 0; k < i; k++ )
            if ( pLutLib->pLutDelays[i][k] != Delay )
                return 1;
    }
    else
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
            if ( pLutLib->pLutDelays[i][0] != Delay )
                return 1;
    }
    return 0;
}